

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUnitTest.h
# Opt level: O2

void Microsoft::VisualStudio::CppUnitTestFramework::Assert::AreEqual<void_const*>
               (void **expected,void **actual,wchar_t *message)

{
  wostream *pwVar1;
  void *ptr;
  void *ptr_00;
  wstring local_60;
  wstring local_40;
  
  if (*expected == *actual) {
    return;
  }
  pwVar1 = std::operator<<((wostream *)&std::wcerr,L"Assert failed. Expected:");
  ToString<void_const>(&local_40,(Assert *)*expected,ptr);
  pwVar1 = std::operator<<(pwVar1,(wstring *)&local_40);
  pwVar1 = std::operator<<(pwVar1,L" Actual:");
  ToString<void_const>(&local_60,(Assert *)*actual,ptr_00);
  pwVar1 = std::operator<<(pwVar1,(wstring *)&local_60);
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar1);
  std::__cxx11::wstring::~wstring((wstring *)&local_60);
  std::__cxx11::wstring::~wstring((wstring *)&local_40);
  if (message != (wchar_t *)0x0) {
    pwVar1 = std::operator<<((wostream *)&std::wcerr,message);
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar1);
  }
  exit(1);
}

Assistant:

static bool Equals(const T& a, const T& b)
    {
        return a == b;
    }